

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# columnref_expression.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnRefExpression::ColumnRefExpression(ColumnRefExpression *this,string *column_name)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28 [24];
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)column_name);
  __l._M_len = 1;
  __l._M_array = &local_48;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_28,__l,&local_49);
  ColumnRefExpression(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)local_28);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_28);
  ::std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

ColumnRefExpression::ColumnRefExpression(string column_name)
    : ColumnRefExpression(vector<string> {std::move(column_name)}) {
}